

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

void __thiscall PSEngine::load_level_internal(PSEngine *this,int p_level_idx)

{
  pointer pCVar1;
  _Atomic_word *p_Var2;
  pointer *ppCVar3;
  int iVar4;
  pointer pLVar5;
  pointer pLVar6;
  PSVector2i *pPVar7;
  element_type *peVar8;
  long lVar9;
  uint uVar10;
  char cVar11;
  int iVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer pLVar13;
  _Base_ptr p_Var14;
  long *plVar15;
  PSVector2i *pPVar16;
  uint uVar17;
  PSVector2i PVar18;
  ulong uVar19;
  ulong uVar20;
  long *plVar21;
  uint __val;
  char cVar22;
  pointer pCVar23;
  pointer pCVar24;
  _Base_ptr p_Var25;
  pointer pLVar26;
  uint __len;
  bool bVar27;
  Level compiled_level;
  string __str_1;
  string __str;
  PSVector2i local_148;
  vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_> local_140;
  undefined1 local_128 [8];
  PSVector2i PStack_120;
  undefined1 local_118 [8];
  pointer pCStack_110;
  pointer local_108;
  pointer local_100;
  _Base_ptr local_f8;
  pointer *local_e8;
  uint local_e0;
  undefined4 uStack_dc;
  pointer local_d8 [2];
  undefined1 local_c8 [24];
  long lStack_b0;
  _Base_ptr local_a0 [2];
  _Base_ptr local_90 [2];
  _Rb_tree_node_base *local_80 [2];
  _Rb_tree_node_base local_70;
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pLVar13 = (this->m_compiled_game).levels.
            super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(long)p_level_idx <
      (ulong)((long)(this->m_compiled_game).levels.
                    super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pLVar13 >> 5)) {
    pLVar5 = (this->m_level_state_stack).
             super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar6 = (this->m_level_state_stack).
             super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar26 = pLVar5;
    if (pLVar6 != pLVar5) {
      do {
        std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector(&pLVar26->cells);
        pLVar26 = pLVar26 + 1;
      } while (pLVar26 != pLVar6);
      (this->m_level_state_stack).
      super__Vector_base<PSEngine::Level,_std::allocator<PSEngine::Level>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar5;
      pLVar13 = (this->m_compiled_game).levels.
                super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    this->m_is_level_won = false;
    this->m_current_tick_time_elapsed = 0.0;
    pLVar13 = pLVar13 + p_level_idx;
    local_148.x = pLVar13->width;
    local_148.y = pLVar13->height;
    std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::vector
              (&local_140,&pLVar13->cells);
    PStack_120.x = 0;
    PStack_120.y = 0;
    local_128._0_4_ = -1;
    local_128._4_4_ = 0;
    (this->m_current_level).size.y = 0;
    (this->m_current_level).level_idx = -1;
    (this->m_current_level).size.x = 0;
    local_c8._16_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_c8._0_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c8._8_8_ =
         (this->m_current_level).cells.
         super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_current_level).cells.
    super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118._0_4_ = 0;
    local_118._4_4_ = 0;
    pCStack_110 = (pointer)0x0;
    local_108 = (pointer)0x0;
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector
              ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_c8);
    std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::~vector
              ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_118);
    (this->m_current_level).level_idx = p_level_idx;
    (this->m_current_level).size = local_148;
    if (local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      local_70._M_left = (_Base_ptr)&(this->m_current_level).cells;
      p_Var25 = (_Base_ptr)0x0;
      do {
        pCVar1 = local_140.
                 super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_118._0_4_ = 0;
        local_118._4_4_ = 0;
        pCStack_110 = (pointer)0x0;
        local_128._0_4_ = 0;
        local_128._4_4_ = 0;
        PStack_120.x = 0;
        PStack_120.y = 0;
        local_108 = (pointer)local_118;
        local_f8 = (_Base_ptr)0x0;
        local_100 = local_108;
        std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::emplace_back<PSEngine::Cell>
                  ((vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *)local_70._M_left,
                   (Cell *)local_128);
        std::
        _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
        ::~_Rb_tree((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,_std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>,_std::_Select1st<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                     *)&PStack_120);
        lVar9 = (long)(this->m_current_level).size.x;
        uVar20 = (ulong)(uint)((int)p_Var25 >> 0x1f) << 0x20 | (ulong)p_Var25 & 0xffffffff;
        (this->m_current_level).cells.
        super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].position =
             (PSVector2i)((long)uVar20 % lVar9 & 0xffffffffU | (long)uVar20 / lVar9 << 0x20);
        pPVar7 = (PSVector2i *)
                 pCVar1[(long)p_Var25].objects.
                 super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_70._M_right = p_Var25;
        for (pPVar16 = (PSVector2i *)
                       pCVar1[(long)p_Var25].objects.
                       super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pPVar16 != pPVar7;
            pPVar16 = pPVar16 + 2) {
          PVar18 = pPVar16[1];
          if (PVar18 == (PSVector2i)0x0) {
            pCVar23 = (this->m_current_level).cells.
                      super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
LAB_0010f643:
            PStack_120.x = 0;
            PStack_120.y = 0;
            local_128._0_4_ = 0;
            local_128._4_4_ = 0;
          }
          else {
            local_128 = *(undefined1 (*) [8])pPVar16;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)PVar18 + 0xc) = *(_Atomic_word *)((long)PVar18 + 0xc) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)PVar18 + 0xc) = *(_Atomic_word *)((long)PVar18 + 0xc) + 1;
            }
            pCVar23 = (this->m_current_level).cells.
                      super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1;
            iVar12 = *(_Atomic_word *)((long)PVar18 + 8);
            do {
              if (iVar12 == 0) goto LAB_0010f643;
              LOCK();
              iVar4 = *(_Atomic_word *)((long)PVar18 + 8);
              bVar27 = iVar12 == iVar4;
              if (bVar27) {
                *(_Atomic_word *)((long)PVar18 + 8) = iVar12 + 1;
                iVar4 = iVar12;
              }
              iVar12 = iVar4;
              UNLOCK();
            } while (!bVar27);
            PStack_120 = PVar18;
            if (*(_Atomic_word *)((long)PVar18 + 8) == 0) {
              local_128._0_4_ = 0;
              local_128._4_4_ = 0;
            }
          }
          local_118._0_4_ = 6;
          std::
          _Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
          ::
          _M_emplace_unique<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                    ((_Rb_tree<std::shared_ptr<CompiledGame::PrimaryObject>,std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>,std::_Select1st<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                      *)&pCVar23->objects,
                     (pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *
                     )local_128);
          if (PStack_120 != (PSVector2i)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)PStack_120);
          }
          if (PVar18 != (PSVector2i)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = (_Atomic_word *)((long)PVar18 + 0xc);
              iVar12 = *p_Var2;
              *p_Var2 = *p_Var2 + -1;
              UNLOCK();
            }
            else {
              iVar12 = *(_Atomic_word *)((long)PVar18 + 0xc);
              *(int *)((long)PVar18 + 0xc) = iVar12 + -1;
            }
            if (iVar12 == 1) {
              (**(code **)(*(long *)PVar18 + 0x18))(PVar18);
            }
          }
        }
        p_Var25 = (_Base_ptr)((long)&(local_70._M_right)->_M_color + 1);
        p_Var14 = (_Base_ptr)
                  (((long)local_140.
                          super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_140.
                          super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
      } while (p_Var25 <= p_Var14 && (long)p_Var14 - (long)p_Var25 != 0);
    }
    std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::~vector(&local_140);
    return;
  }
  if (4 < (int)(this->m_config).log_verbosity) {
    return;
  }
  peVar8 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_80[0] = &local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
             m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
             m_engine_log_cat_abi_cxx11_._M_string_length);
  __val = -p_level_idx;
  if (0 < p_level_idx) {
    __val = p_level_idx;
  }
  __len = 1;
  if (9 < __val) {
    uVar20 = (ulong)__val;
    uVar10 = 4;
    do {
      __len = uVar10;
      uVar17 = (uint)uVar20;
      if (uVar17 < 100) {
        __len = __len - 2;
        goto LAB_0010f7c8;
      }
      if (uVar17 < 1000) {
        __len = __len - 1;
        goto LAB_0010f7c8;
      }
      if (uVar17 < 10000) goto LAB_0010f7c8;
      uVar20 = uVar20 / 10000;
      uVar10 = __len + 4;
    } while (99999 < uVar17);
    __len = __len + 1;
  }
LAB_0010f7c8:
  local_a0[0] = (_Base_ptr)local_90;
  std::__cxx11::string::_M_construct((ulong)local_a0,(char)__len - (char)(p_level_idx >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)&local_a0[0]->_M_color + (ulong)((uint)p_level_idx >> 0x1f)),__len,__val
            );
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_a0,0,(char *)0x0,0x14bfc7);
  pCVar23 = (pointer)(plVar15 + 2);
  if ((pointer)*plVar15 == pCVar23) {
    local_c8._16_8_ = pCVar23->position;
    lStack_b0 = plVar15[3];
    local_c8._0_8_ = (pointer)(local_c8 + 0x10);
  }
  else {
    local_c8._16_8_ = pCVar23->position;
    local_c8._0_8_ = (pointer)*plVar15;
  }
  local_c8._8_8_ = plVar15[1];
  *plVar15 = (long)pCVar23;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  pPVar16 = (PSVector2i *)std::__cxx11::string::append(local_c8);
  ppCVar3 = &local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  PVar18 = (PSVector2i)(pPVar16 + 2);
  if (*pPVar16 == PVar18) {
    local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)PVar18;
    local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)(pPVar16 + 3);
    local_148 = (PSVector2i)ppCVar3;
  }
  else {
    local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = *(pointer *)PVar18;
    local_148 = *pPVar16;
  }
  local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(pPVar16 + 1);
  *pPVar16 = PVar18;
  pPVar16[1].x = 0;
  pPVar16[1].y = 0;
  *(undefined1 *)&pPVar16[2].x = 0;
  uVar20 = (long)(this->m_compiled_game).levels.
                 super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_compiled_game).levels.
                 super__Vector_base<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 5;
  cVar22 = '\x01';
  if (9 < uVar20) {
    uVar19 = uVar20;
    cVar11 = '\x04';
    do {
      cVar22 = cVar11;
      if (uVar19 < 100) {
        cVar22 = cVar22 + -2;
        goto LAB_0010f935;
      }
      if (uVar19 < 1000) {
        cVar22 = cVar22 + -1;
        goto LAB_0010f935;
      }
      if (uVar19 < 10000) goto LAB_0010f935;
      bVar27 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      cVar11 = cVar22 + '\x04';
    } while (bVar27);
    cVar22 = cVar22 + '\x01';
  }
LAB_0010f935:
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct((ulong)&local_e8,cVar22);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e8,local_e0,uVar20);
  pCVar1 = (pointer)((long)local_140.
                           super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                           ._M_impl.super__Vector_impl_data._M_start + CONCAT44(uStack_dc,local_e0))
  ;
  pCVar24 = (pointer)0xf;
  if (local_148 != (PSVector2i)ppCVar3) {
    pCVar24 = local_140.super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pCVar24 < pCVar1) {
    pCVar24 = (pointer)0xf;
    if (local_e8 != local_d8) {
      pCVar24 = local_d8[0];
    }
    if (pCVar1 <= pCVar24) {
      pPVar16 = (PSVector2i *)
                std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,(ulong)local_148);
      goto LAB_0010f9b7;
    }
  }
  pPVar16 = (PSVector2i *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_e8);
LAB_0010f9b7:
  local_128 = (undefined1  [8])local_118;
  PVar18 = (PSVector2i)(pPVar16 + 2);
  if (*pPVar16 == PVar18) {
    local_118 = *(undefined1 (*) [8])PVar18;
    pCStack_110 = *(pointer *)(pPVar16 + 3);
  }
  else {
    local_118 = *(undefined1 (*) [8])PVar18;
    local_128 = (undefined1  [8])*pPVar16;
  }
  PStack_120 = pPVar16[1];
  *pPVar16 = PVar18;
  pPVar16[1].x = 0;
  pPVar16[1].y = 0;
  *(undefined1 *)PVar18 = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_128);
  plVar21 = plVar15 + 2;
  if ((long *)*plVar15 == plVar21) {
    local_40 = *plVar21;
    uStack_38 = (undefined4)plVar15[3];
    uStack_34 = *(undefined4 *)((long)plVar15 + 0x1c);
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar21;
    local_50 = (long *)*plVar15;
  }
  local_48 = plVar15[1];
  *plVar15 = (long)plVar21;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  (*peVar8->_vptr_PSLogger[2])(peVar8,4,local_80);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_128 != (undefined1  [8])local_118) {
    operator_delete((void *)local_128,(ulong)((long)local_118 + 1));
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8,(ulong)((long)&(local_d8[0]->objects).
                                            super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (local_148 != (PSVector2i)ppCVar3) {
    operator_delete((void *)local_148,
                    (ulong)((long)&((local_140.
                                     super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->objects).
                                   super__Vector_base<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if (local_a0[0] != (_Base_ptr)local_90) {
    operator_delete(local_a0[0],(ulong)((long)&local_90[0]->_M_color + 1));
  }
  if (local_80[0] != &local_70) {
    operator_delete(local_80[0],local_70._0_8_ + 1);
  }
  if ((this->m_config).log_operation_history_after_error == true) {
    print_operation_history(this);
  }
  return;
}

Assistant:

void PSEngine::load_level_internal(int p_level_idx)
{
    if(p_level_idx >= m_compiled_game.levels.size())
    {
        PS_LOG_ERROR("Cannot load level "+to_string(p_level_idx)+", there's only "+to_string(m_compiled_game.levels.size())+" levels.");
        return;
    }
    m_level_state_stack.clear();
    m_is_level_won = false;
    m_current_tick_time_elapsed = 0;

    CompiledGame::Level compiled_level = m_compiled_game.levels[p_level_idx];

    m_current_level = Level();

    m_current_level.level_idx = p_level_idx;
    m_current_level.size = PSVector2i(compiled_level.width, compiled_level.height);


    for(int i = 0; i < compiled_level.cells.size(); ++i)
    {
        const auto& cell = compiled_level.cells[i];

        m_current_level.cells.push_back(Cell());

        m_current_level.cells.back().position = PSVector2i( i % m_current_level.size.x, i / m_current_level.size.x);

        for(weak_ptr<CompiledGame::PrimaryObject> obj : cell.objects)
        {
            m_current_level.cells.back().objects.insert(make_pair(obj.lock(),ObjectMoveType::Stationary));
        }
    }
}